

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O3

void prvTidyConvertCDATANodes(TidyDocImpl *doc,Node *node)

{
  Node *pNVar1;
  
  if (node != (Node *)0x0) {
    do {
      if (node->type == CDATATag) {
        node->type = TextNode;
      }
      pNVar1 = node->next;
      if (node->content != (Node *)0x0) {
        prvTidyConvertCDATANodes(doc,node->content);
      }
      node = pNVar1;
    } while (pNVar1 != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(ConvertCDATANodes)(TidyDocImpl* doc, Node* node)
{
    Node* next;

    while (node)
    {
        next = node->next;

        if (node->type == CDATATag)
            node->type = TextNode;

        if (node->content)
            TY_(ConvertCDATANodes)(doc, node->content);

        node = next;
    }
}